

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctfst.c
# Opt level: O3

void jpeg_idct_ifast(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  JSAMPLE *pJVar2;
  void *pvVar3;
  int iVar4;
  short sVar5;
  JSAMPLE JVar6;
  int iVar7;
  short sVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  JSAMPLE *pJVar13;
  short sVar14;
  long lVar15;
  short sVar16;
  int iVar17;
  short sVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  short sVar22;
  short sVar23;
  int iVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  int iVar29;
  undefined1 auVar30 [16];
  uint auStack_154 [7];
  uint auStack_138 [66];
  
  pJVar2 = cinfo->sample_range_limit;
  pvVar3 = compptr->dct_table;
  uVar11 = 9;
  lVar12 = 0;
  do {
    sVar16 = *(short *)((long)coef_block + lVar12 + 0x10);
    sVar25 = *(short *)((long)coef_block + lVar12 + 0x20);
    if (sVar25 == 0 && sVar16 == 0) {
      if ((((*(short *)((long)coef_block + lVar12 + 0x30) != 0) ||
           (*(short *)((long)coef_block + lVar12 + 0x40) != 0)) ||
          (*(short *)((long)coef_block + lVar12 + 0x50) != 0)) ||
         ((*(short *)((long)coef_block + lVar12 + 0x60) != 0 ||
          (*(short *)((long)coef_block + lVar12 + 0x70) != 0)))) {
        sVar25 = 0;
        goto LAB_0012d4b3;
      }
      iVar4 = (int)*(short *)((long)pvVar3 + lVar12) * (int)*(short *)((long)coef_block + lVar12);
      *(int *)((long)auStack_154 + lVar12 * 2 + 0x1c) = iVar4;
      *(int *)((long)auStack_154 + lVar12 * 2 + 0x3c) = iVar4;
      *(int *)((long)auStack_154 + lVar12 * 2 + 0x5c) = iVar4;
      *(int *)((long)auStack_154 + lVar12 * 2 + 0x7c) = iVar4;
      *(int *)((long)auStack_154 + lVar12 * 2 + 0x9c) = iVar4;
      *(int *)((long)auStack_154 + lVar12 * 2 + 0xbc) = iVar4;
      *(int *)((long)auStack_154 + lVar12 * 2 + 0xdc) = iVar4;
      lVar15 = 0xe0;
    }
    else {
LAB_0012d4b3:
      sVar14 = *(short *)((long)pvVar3 + lVar12) * *(short *)((long)coef_block + lVar12);
      sVar25 = sVar25 * *(short *)((long)pvVar3 + lVar12 + 0x20);
      sVar5 = *(short *)((long)pvVar3 + lVar12 + 0x40) *
              *(short *)((long)coef_block + lVar12 + 0x40);
      sVar18 = *(short *)((long)pvVar3 + lVar12 + 0x60) *
               *(short *)((long)coef_block + lVar12 + 0x60);
      sVar22 = sVar18 + sVar25;
      sVar8 = sVar5 + sVar14;
      sVar14 = sVar14 - sVar5;
      sVar25 = (short)((uint)(((int)sVar25 - (int)sVar18) * 0x16a00) >> 0x10) - sVar22;
      sVar16 = sVar16 * *(short *)((long)pvVar3 + lVar12 + 0x10);
      sVar26 = *(short *)((long)pvVar3 + lVar12 + 0x30) *
               *(short *)((long)coef_block + lVar12 + 0x30);
      sVar18 = *(short *)((long)pvVar3 + lVar12 + 0x50) *
               *(short *)((long)coef_block + lVar12 + 0x50);
      sVar5 = *(short *)((long)pvVar3 + lVar12 + 0x70) *
              *(short *)((long)coef_block + lVar12 + 0x70);
      sVar23 = sVar18 + sVar26;
      sVar27 = sVar5 + sVar16;
      sVar28 = sVar27 + sVar23;
      iVar4 = (int)(short)(sVar18 - sVar26);
      iVar19 = (int)(short)(sVar16 - sVar5);
      uVar20 = (iVar19 + iVar4) * 0x1d900 & 0xffff0000;
      sVar16 = (short)(iVar4 * -0x29d00 + uVar20 >> 0x10) - sVar28;
      sVar5 = (short)((uint)(((int)sVar27 - (int)sVar23) * 0x16a00) >> 0x10) - sVar16;
      iVar4 = (int)(short)(sVar8 + sVar22);
      *(int *)((long)auStack_154 + lVar12 * 2 + 0x1c) = iVar4 + sVar28;
      *(int *)((long)auStack_154 + lVar12 * 2 + 0xfc) = iVar4 - sVar28;
      iVar4 = (int)(short)(sVar25 + sVar14);
      *(int *)((long)auStack_154 + lVar12 * 2 + 0x3c) = sVar16 + iVar4;
      *(int *)((long)auStack_154 + lVar12 * 2 + 0xdc) = iVar4 - sVar16;
      iVar4 = (int)(short)(sVar14 - sVar25);
      *(int *)((long)auStack_154 + lVar12 * 2 + 0x5c) = sVar5 + iVar4;
      *(int *)((long)auStack_154 + lVar12 * 2 + 0xbc) = iVar4 - sVar5;
      iVar4 = (int)(short)(sVar8 - sVar22);
      iVar19 = (int)(short)((short)(iVar19 * 0x11500 - uVar20 >> 0x10) + sVar5);
      *(int *)((long)auStack_154 + lVar12 * 2 + 0x9c) = iVar19 + iVar4;
      iVar4 = iVar4 - iVar19;
      lVar15 = 0x60;
    }
    *(int *)((long)auStack_154 + lVar12 * 2 + lVar15 + 0x1c) = iVar4;
    uVar11 = uVar11 - 1;
    lVar12 = lVar12 + 2;
  } while (1 < uVar11);
  lVar12 = 7;
  do {
    pJVar13 = (JSAMPLE *)(*(long *)((long)output_buf + lVar12 + -7) + (ulong)output_col);
    uVar11 = auStack_154[lVar12 + 1];
    uVar20 = auStack_154[lVar12 + 2];
    if (auStack_154[lVar12 + 2] == 0 && uVar11 == 0) {
      uVar10 = 0;
      uVar20 = 0;
      if (((auStack_154[lVar12 + 3] != 0) || (auStack_154[lVar12 + 4] != 0)) ||
         ((uVar20 = uVar10, auStack_154[lVar12 + 5] != 0 ||
          ((auStack_154[lVar12 + 6] != 0 || (auStack_154[lVar12 + 7] != 0)))))) goto LAB_0012d6b0;
      JVar6 = pJVar2[(ulong)(auStack_154[lVar12] >> 5 & 0x3ff) + 0x80];
      auVar30 = pshuflw(ZEXT216(CONCAT11(JVar6,JVar6)),ZEXT216(CONCAT11(JVar6,JVar6)),0);
      *(int *)pJVar13 = auVar30._0_4_;
      pJVar13[4] = JVar6;
      pJVar13[5] = JVar6;
      pJVar13[6] = JVar6;
      lVar15 = 7;
    }
    else {
LAB_0012d6b0:
      iVar4 = auStack_154[lVar12 + 4] + auStack_154[lVar12];
      iVar17 = auStack_154[lVar12] - auStack_154[lVar12 + 4];
      iVar19 = auStack_154[lVar12 + 6] + uVar20;
      iVar29 = iVar19 + iVar4;
      iVar4 = iVar4 - iVar19;
      iVar24 = ((int)(short)uVar20 - (int)(short)auStack_154[lVar12 + 6]) * 0x16a00 +
               iVar19 * -0x10000 >> 0x10;
      iVar19 = iVar17 + iVar24;
      iVar17 = iVar17 - iVar24;
      iVar24 = auStack_154[lVar12 + 3] + auStack_154[lVar12 + 5];
      iVar1 = auStack_154[lVar12 + 7] + uVar11;
      iVar21 = iVar1 + iVar24;
      iVar7 = (int)(short)((short)auStack_154[lVar12 + 5] - (short)auStack_154[lVar12 + 3]);
      iVar9 = (int)(short)((short)uVar11 - (short)auStack_154[lVar12 + 7]);
      uVar20 = (iVar9 + iVar7) * 0x1d900 & 0xffff0000;
      uVar11 = iVar7 * -0x29d00 + iVar21 * -0x10000 + uVar20;
      iVar7 = (int)uVar11 >> 0x10;
      uVar11 = ((int)(short)iVar1 - (int)(short)iVar24) * 0x16a00 - (uVar11 & 0xffff0000);
      iVar24 = (int)uVar11 >> 0x10;
      *pJVar13 = pJVar2[(ulong)((uint)(iVar21 + iVar29) >> 5 & 0x3ff) + 0x80];
      pJVar13[7] = pJVar2[(ulong)((uint)(iVar29 - iVar21) >> 5 & 0x3ff) + 0x80];
      pJVar13[1] = pJVar2[(ulong)((uint)(iVar7 + iVar19) >> 5 & 0x3ff) + 0x80];
      pJVar13[6] = pJVar2[(ulong)((uint)(iVar19 - iVar7) >> 5 & 0x3ff) + 0x80];
      pJVar13[2] = pJVar2[(ulong)((uint)(iVar24 + iVar17) >> 5 & 0x3ff) + 0x80];
      pJVar13[5] = pJVar2[(ulong)((uint)(iVar17 - iVar24) >> 5 & 0x3ff) + 0x80];
      iVar19 = (int)((uVar11 & 0xffff0000) + (iVar9 * 0x11500 - uVar20)) >> 0x10;
      pJVar13[4] = pJVar2[(ulong)((uint)(iVar19 + iVar4) >> 5 & 0x3ff) + 0x80];
      JVar6 = pJVar2[(ulong)((uint)(iVar4 - iVar19) >> 5 & 0x3ff) + 0x80];
      lVar15 = 3;
    }
    pJVar13[lVar15] = JVar6;
    lVar12 = lVar12 + 8;
    if (lVar12 == 0x47) {
      return;
    }
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_idct_ifast(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  DCTELEM tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  DCTELEM tmp10, tmp11, tmp12, tmp13;
  DCTELEM z5, z10, z11, z12, z13;
  JCOEFPTR inptr;
  IFAST_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[DCTSIZE2];      /* buffers data between passes */
  SHIFT_TEMPS                   /* for DESCALE */
  ISHIFT_TEMPS                  /* for IDESCALE */

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (IFAST_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = DCTSIZE; ctr > 0; ctr--) {
    /* Due to quantization, we will usually find that many of the input
     * coefficients are zero, especially the AC terms.  We can exploit this
     * by short-circuiting the IDCT calculation for any column in which all
     * the AC terms are zero.  In that case each output is equal to the
     * DC coefficient (with scale factor as needed).
     * With typical images and quantization tables, half or more of the
     * column DCT calculations can be simplified this way.
     */

    if (inptr[DCTSIZE * 1] == 0 && inptr[DCTSIZE * 2] == 0 &&
        inptr[DCTSIZE * 3] == 0 && inptr[DCTSIZE * 4] == 0 &&
        inptr[DCTSIZE * 5] == 0 && inptr[DCTSIZE * 6] == 0 &&
        inptr[DCTSIZE * 7] == 0) {
      /* AC terms all zero */
      int dcval = (int)DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);

      wsptr[DCTSIZE * 0] = dcval;
      wsptr[DCTSIZE * 1] = dcval;
      wsptr[DCTSIZE * 2] = dcval;
      wsptr[DCTSIZE * 3] = dcval;
      wsptr[DCTSIZE * 4] = dcval;
      wsptr[DCTSIZE * 5] = dcval;
      wsptr[DCTSIZE * 6] = dcval;
      wsptr[DCTSIZE * 7] = dcval;

      inptr++;                  /* advance pointers to next column */
      quantptr++;
      wsptr++;
      continue;
    }

    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp1 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    tmp3 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    tmp10 = tmp0 + tmp2;        /* phase 3 */
    tmp11 = tmp0 - tmp2;

    tmp13 = tmp1 + tmp3;        /* phases 5-3 */
    tmp12 = MULTIPLY(tmp1 - tmp3, FIX_1_414213562) - tmp13; /* 2*c4 */

    tmp0 = tmp10 + tmp13;       /* phase 2 */
    tmp3 = tmp10 - tmp13;
    tmp1 = tmp11 + tmp12;
    tmp2 = tmp11 - tmp12;

    /* Odd part */

    tmp4 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    tmp5 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    tmp6 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    tmp7 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);

    z13 = tmp6 + tmp5;          /* phase 6 */
    z10 = tmp6 - tmp5;
    z11 = tmp4 + tmp7;
    z12 = tmp4 - tmp7;

    tmp7 = z11 + z13;           /* phase 5 */
    tmp11 = MULTIPLY(z11 - z13, FIX_1_414213562); /* 2*c4 */

    z5 = MULTIPLY(z10 + z12, FIX_1_847759065); /* 2*c2 */
    tmp10 = MULTIPLY(z12, FIX_1_082392200) - z5; /* 2*(c2-c6) */
    tmp12 = MULTIPLY(z10, -FIX_2_613125930) + z5; /* -2*(c2+c6) */

    tmp6 = tmp12 - tmp7;        /* phase 2 */
    tmp5 = tmp11 - tmp6;
    tmp4 = tmp10 + tmp5;

    wsptr[DCTSIZE * 0] = (int)(tmp0 + tmp7);
    wsptr[DCTSIZE * 7] = (int)(tmp0 - tmp7);
    wsptr[DCTSIZE * 1] = (int)(tmp1 + tmp6);
    wsptr[DCTSIZE * 6] = (int)(tmp1 - tmp6);
    wsptr[DCTSIZE * 2] = (int)(tmp2 + tmp5);
    wsptr[DCTSIZE * 5] = (int)(tmp2 - tmp5);
    wsptr[DCTSIZE * 4] = (int)(tmp3 + tmp4);
    wsptr[DCTSIZE * 3] = (int)(tmp3 - tmp4);

    inptr++;                    /* advance pointers to next column */
    quantptr++;
    wsptr++;
  }

  /* Pass 2: process rows from work array, store into output array. */
  /* Note that we must descale the results by a factor of 8 == 2**3, */
  /* and also undo the PASS1_BITS scaling. */

  wsptr = workspace;
  for (ctr = 0; ctr < DCTSIZE; ctr++) {
    outptr = output_buf[ctr] + output_col;
    /* Rows of zeroes can be exploited in the same way as we did with columns.
     * However, the column calculation has created many nonzero AC terms, so
     * the simplification applies less often (typically 5% to 10% of the time).
     * On machines with very fast multiplication, it's possible that the
     * test takes more time than it's worth.  In that case this section
     * may be commented out.
     */

#ifndef NO_ZERO_ROW_TEST
    if (wsptr[1] == 0 && wsptr[2] == 0 && wsptr[3] == 0 && wsptr[4] == 0 &&
        wsptr[5] == 0 && wsptr[6] == 0 && wsptr[7] == 0) {
      /* AC terms all zero */
      JSAMPLE dcval =
        range_limit[IDESCALE(wsptr[0], PASS1_BITS + 3) & RANGE_MASK];

      outptr[0] = dcval;
      outptr[1] = dcval;
      outptr[2] = dcval;
      outptr[3] = dcval;
      outptr[4] = dcval;
      outptr[5] = dcval;
      outptr[6] = dcval;
      outptr[7] = dcval;

      wsptr += DCTSIZE;         /* advance pointer to next row */
      continue;
    }
#endif

    /* Even part */

    tmp10 = ((DCTELEM)wsptr[0] + (DCTELEM)wsptr[4]);
    tmp11 = ((DCTELEM)wsptr[0] - (DCTELEM)wsptr[4]);

    tmp13 = ((DCTELEM)wsptr[2] + (DCTELEM)wsptr[6]);
    tmp12 =
      MULTIPLY((DCTELEM)wsptr[2] - (DCTELEM)wsptr[6], FIX_1_414213562) - tmp13;

    tmp0 = tmp10 + tmp13;
    tmp3 = tmp10 - tmp13;
    tmp1 = tmp11 + tmp12;
    tmp2 = tmp11 - tmp12;

    /* Odd part */

    z13 = (DCTELEM)wsptr[5] + (DCTELEM)wsptr[3];
    z10 = (DCTELEM)wsptr[5] - (DCTELEM)wsptr[3];
    z11 = (DCTELEM)wsptr[1] + (DCTELEM)wsptr[7];
    z12 = (DCTELEM)wsptr[1] - (DCTELEM)wsptr[7];

    tmp7 = z11 + z13;           /* phase 5 */
    tmp11 = MULTIPLY(z11 - z13, FIX_1_414213562); /* 2*c4 */

    z5 = MULTIPLY(z10 + z12, FIX_1_847759065); /* 2*c2 */
    tmp10 = MULTIPLY(z12, FIX_1_082392200) - z5; /* 2*(c2-c6) */
    tmp12 = MULTIPLY(z10, -FIX_2_613125930) + z5; /* -2*(c2+c6) */

    tmp6 = tmp12 - tmp7;        /* phase 2 */
    tmp5 = tmp11 - tmp6;
    tmp4 = tmp10 + tmp5;

    /* Final output stage: scale down by a factor of 8 and range-limit */

    outptr[0] =
      range_limit[IDESCALE(tmp0 + tmp7, PASS1_BITS + 3) & RANGE_MASK];
    outptr[7] =
      range_limit[IDESCALE(tmp0 - tmp7, PASS1_BITS + 3) & RANGE_MASK];
    outptr[1] =
      range_limit[IDESCALE(tmp1 + tmp6, PASS1_BITS + 3) & RANGE_MASK];
    outptr[6] =
      range_limit[IDESCALE(tmp1 - tmp6, PASS1_BITS + 3) & RANGE_MASK];
    outptr[2] =
      range_limit[IDESCALE(tmp2 + tmp5, PASS1_BITS + 3) & RANGE_MASK];
    outptr[5] =
      range_limit[IDESCALE(tmp2 - tmp5, PASS1_BITS + 3) & RANGE_MASK];
    outptr[4] =
      range_limit[IDESCALE(tmp3 + tmp4, PASS1_BITS + 3) & RANGE_MASK];
    outptr[3] =
      range_limit[IDESCALE(tmp3 - tmp4, PASS1_BITS + 3) & RANGE_MASK];

    wsptr += DCTSIZE;           /* advance pointer to next row */
  }
}